

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# moc_qcombobox.cpp
# Opt level: O1

void QComboBox::qt_static_metacall(QObject *_o,Call _c,int _id,void **_a)

{
  long *plVar1;
  QSize *pQVar2;
  long lVar3;
  QSize QVar4;
  QSize QVar5;
  QSize QVar6;
  byte bVar7;
  int iVar8;
  QSize QVar9;
  long in_FS_OFFSET;
  undefined4 local_5c;
  anon_union_24_3_e3d07ef4_for_data local_58;
  char *pcStack_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  switch(_c);
  switch(_id) {
  case 0:
    local_58._8_8_ = *(QSize *)(_a + 1);
    iVar8 = 0;
    goto LAB_003e42a3;
  case 1:
    local_5c = *_a[1];
    local_58._8_8_ = &local_5c;
    iVar8 = 1;
    goto LAB_003e42a3;
  case 2:
    local_58._8_8_ = *(QSize *)(_a + 1);
    iVar8 = 2;
    goto LAB_003e42a3;
  case 3:
    local_5c = *_a[1];
    local_58._8_8_ = &local_5c;
    iVar8 = 3;
    goto LAB_003e42a3;
  case 4:
    local_58._8_8_ = *(QSize *)(_a + 1);
    iVar8 = 4;
    goto LAB_003e42a3;
  case 5:
    local_5c = *_a[1];
    local_58._8_8_ = &local_5c;
    iVar8 = 5;
    goto LAB_003e42a3;
  case 6:
    local_58._8_8_ = *(QSize *)(_a + 1);
    iVar8 = 6;
LAB_003e42a3:
    local_58._4_4_ = 0;
    local_58._0_4_ = 0;
    QMetaObject::activate(_o,&staticMetaObject,iVar8,&local_58.shared);
    break;
  case 7:
    clear((QComboBox *)_o);
    break;
  case 8:
    clearEditText((QComboBox *)_o);
    break;
  case 9:
    setEditText((QComboBox *)_o,(QString *)_a[1]);
    break;
  case 10:
    setCurrentIndex((QComboBox *)_o,*_a[1]);
    break;
  case 0xb:
    setCurrentText((QComboBox *)_o,(QString *)_a[1]);
    break;
  case 0xc:
    local_58._16_4_ = -0x55555556;
    local_58._20_4_ = -0x55555556;
    pcStack_40 = &DAT_aaaaaaaaaaaaaaaa;
    local_58._0_4_ = -0x55555556;
    local_58._4_4_ = -0x55555556;
    local_58._8_4_ = -0x55555556;
    local_58._12_4_ = -0x55555556;
    inputMethodQuery((QVariant *)&local_58,(QComboBox *)_o,*_a[1],(QVariant *)_a[2]);
    if ((QVariant *)*_a != (QVariant *)0x0) {
      ::QVariant::operator=((QVariant *)*_a,(QVariant *)&local_58);
    }
    ::QVariant::~QVariant((QVariant *)&local_58);
  }
  if (_c != ReadProperty) {
    if (_c != WriteProperty) {
      if (_c != IndexOfMethod) goto switchD_003e40a4_caseD_3;
      plVar1 = (long *)_a[1];
      if (((code *)*plVar1 == editTextChanged) && (plVar1[1] == 0)) {
        *(undefined4 *)*_a = 0;
        goto switchD_003e40a4_caseD_3;
      }
      if (((code *)*plVar1 == activated) && (plVar1[1] == 0)) {
        *(undefined4 *)*_a = 1;
        goto switchD_003e40a4_caseD_3;
      }
      if (((code *)*plVar1 == textActivated) && (plVar1[1] == 0)) {
        *(undefined4 *)*_a = 2;
        goto switchD_003e40a4_caseD_3;
      }
      if (((code *)*plVar1 == highlighted) && (plVar1[1] == 0)) {
        *(undefined4 *)*_a = 3;
        goto switchD_003e40a4_caseD_3;
      }
      if (((code *)*plVar1 == textHighlighted) && (plVar1[1] == 0)) {
        *(undefined4 *)*_a = 4;
        goto switchD_003e40a4_caseD_3;
      }
      if (((code *)*plVar1 == currentIndexChanged) && (plVar1[1] == 0)) {
        *(undefined4 *)*_a = 5;
        goto switchD_003e40a4_caseD_3;
      }
      if (((code *)*plVar1 == currentTextChanged) && (plVar1[1] == 0)) {
        *(undefined4 *)*_a = 6;
        goto switchD_003e40a4_caseD_3;
      }
      if (_c != WriteProperty) {
        if (_c != ReadProperty) goto switchD_003e40a4_caseD_3;
        goto switchD_003e40a4_caseD_1;
      }
    }
    goto switchD_003e40a4_caseD_2;
  }
switchD_003e40a4_caseD_1:
  if (0xf < (uint)_id) goto LAB_003e45ad;
  pQVar2 = (QSize *)*_a;
  switch(_id) {
  case 0:
    (((Private *)&pQVar2->wd)->data).data[0] = *(long *)(*(long *)(_o + 8) + 0x2a0) != 0;
    goto LAB_003e45ad;
  case 1:
    iVar8 = count((QComboBox *)_o);
    break;
  case 2:
    currentText((QString *)&local_58,(QComboBox *)_o);
    QVar6 = *pQVar2;
    QVar9.ht.m_i = local_58._4_4_;
    QVar9.wd.m_i = local_58._0_4_;
    *pQVar2 = QVar9;
    local_58._0_4_ = QVar6.wd.m_i;
    local_58._4_4_ = QVar6.ht.m_i;
    QVar9 = pQVar2[1];
    pQVar2[1].wd = (Representation)local_58._8_4_;
    pQVar2[1].ht = (Representation)local_58._12_4_;
    QVar4 = pQVar2[2];
    QVar5.ht.m_i = local_58._20_4_;
    QVar5.wd.m_i = local_58._16_4_;
    pQVar2[2] = QVar5;
    local_58._16_4_ = QVar4.wd.m_i;
    local_58._20_4_ = QVar4.ht.m_i;
    local_58._8_8_ = QVar9;
    if (QVar6 != (QSize)0x0) {
      LOCK();
      *(int *)QVar6 = *(int *)QVar6 + -1;
      iVar8 = *(int *)QVar6;
      UNLOCK();
joined_r0x003e4468:
      if (iVar8 == 0) {
        QArrayData::deallocate((QArrayData *)QVar6,2,0x10);
      }
    }
    goto LAB_003e45ad;
  case 3:
    iVar8 = QPersistentModelIndex::row();
    break;
  case 4:
    QPersistentModelIndex::data((int)&local_58);
    ::QVariant::operator=((QVariant *)pQVar2,(QVariant *)&local_58);
    ::QVariant::~QVariant((QVariant *)&local_58);
    goto LAB_003e45ad;
  case 5:
    iVar8 = *(int *)(*(long *)(_o + 8) + 0x33c);
    break;
  case 6:
    iVar8 = *(int *)(*(long *)(_o + 8) + 0x340);
    break;
  case 7:
    iVar8 = *(int *)(*(long *)(_o + 8) + 800);
    break;
  case 8:
    iVar8 = *(int *)(*(long *)(_o + 8) + 0x324);
    break;
  case 9:
    iVar8 = *(int *)(*(long *)(_o + 8) + 0x334);
    break;
  case 10:
    QVar9 = iconSize((QComboBox *)_o);
    *pQVar2 = QVar9;
    goto LAB_003e45ad;
  case 0xb:
    lVar3 = *(long *)(_o + 8);
    QVar9 = *(QSize *)(lVar3 + 0x2c8);
    QVar4 = *(QSize *)(lVar3 + 0x2d0);
    QVar5 = *(QSize *)(lVar3 + 0x2d8);
    if (QVar9 != (QSize)0x0) {
      LOCK();
      *(int *)QVar9 = *(int *)QVar9 + 1;
      UNLOCK();
    }
    QVar6 = *pQVar2;
    *pQVar2 = QVar9;
    pQVar2[1] = QVar4;
    pQVar2[2] = QVar5;
    if (QVar6 != (QSize)0x0) {
      LOCK();
      *(int *)QVar6 = *(int *)QVar6 + -1;
      iVar8 = *(int *)QVar6;
      UNLOCK();
      goto joined_r0x003e4468;
    }
    goto LAB_003e45ad;
  case 0xc:
    bVar7 = *(byte *)(*(long *)(_o + 8) + 0x34c) >> 1;
    goto LAB_003e457d;
  case 0xd:
    bVar7 = *(byte *)(*(long *)(_o + 8) + 0x34c) >> 2;
LAB_003e457d:
    (((Private *)&pQVar2->wd)->data).data[0] = bVar7 & 1;
    goto LAB_003e45ad;
  case 0xe:
    iVar8 = *(int *)(*(long *)(_o + 8) + 0x344);
    break;
  case 0xf:
    iVar8 = *(int *)(*(long *)(_o + 8) + 0x330);
  }
  *(int *)&((Private *)&pQVar2->wd)->data = iVar8;
LAB_003e45ad:
  if (_c == WriteProperty) {
switchD_003e40a4_caseD_2:
    if ((uint)_id < 0x10) {
      pQVar2 = (QSize *)*_a;
      switch(_id) {
      case 0:
        setEditable((QComboBox *)_o,SUB41((pQVar2->wd).m_i,0));
        break;
      case 2:
        setCurrentText((QComboBox *)_o,(QString *)pQVar2);
        break;
      case 3:
        setCurrentIndex((QComboBox *)_o,(pQVar2->wd).m_i);
        break;
      case 5:
        iVar8 = (pQVar2->wd).m_i;
        if (iVar8 < 0) {
          local_58._0_4_ = 2;
          local_58._4_4_ = 0;
          local_58._8_4_ = 0;
          local_58._12_4_ = 0;
          local_58._16_4_ = 0;
          local_58._20_4_ = 0;
          pcStack_40 = "default";
          QMessageLogger::warning
                    ((char *)local_58.data,
                     "QComboBox::setMaxVisibleItems: Invalid max visible items (%d) must be >= 0");
        }
        else {
          *(int *)(*(long *)(_o + 8) + 0x33c) = iVar8;
        }
        break;
      case 6:
        setMaxCount((QComboBox *)_o,(pQVar2->wd).m_i);
        break;
      case 7:
        *(int *)(*(long *)(_o + 8) + 800) = (pQVar2->wd).m_i;
        break;
      case 8:
        setSizeAdjustPolicy((QComboBox *)_o,(pQVar2->wd).m_i);
        break;
      case 9:
        setMinimumContentsLength((QComboBox *)_o,(pQVar2->wd).m_i);
        break;
      case 10:
        setIconSize((QComboBox *)_o,pQVar2);
        break;
      case 0xb:
        setPlaceholderText((QComboBox *)_o,(QString *)pQVar2);
        break;
      case 0xc:
        *(byte *)(*(long *)(_o + 8) + 0x34c) =
             *(byte *)(*(long *)(_o + 8) + 0x34c) & 0xfd | (char)(pQVar2->wd).m_i * '\x02';
        break;
      case 0xd:
        *(byte *)(*(long *)(_o + 8) + 0x34c) =
             *(byte *)(*(long *)(_o + 8) + 0x34c) & 0xfb | (char)(pQVar2->wd).m_i << 2;
        QWidget::update((QWidget *)_o);
        QWidget::updateGeometry((QWidget *)_o);
        break;
      case 0xe:
        setModelColumn((QComboBox *)_o,(pQVar2->wd).m_i);
        break;
      case 0xf:
        iVar8 = (pQVar2->wd).m_i;
        if (*(int *)(*(long *)(_o + 8) + 0x330) != iVar8) {
          *(int *)(*(long *)(_o + 8) + 0x330) = iVar8;
          QWidget::update((QWidget *)_o);
        }
      }
    }
  }
switchD_003e40a4_caseD_3:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QComboBox::qt_static_metacall(QObject *_o, QMetaObject::Call _c, int _id, void **_a)
{
    auto *_t = static_cast<QComboBox *>(_o);
    if (_c == QMetaObject::InvokeMetaMethod) {
        switch (_id) {
        case 0: _t->editTextChanged((*reinterpret_cast< std::add_pointer_t<QString>>(_a[1]))); break;
        case 1: _t->activated((*reinterpret_cast< std::add_pointer_t<int>>(_a[1]))); break;
        case 2: _t->textActivated((*reinterpret_cast< std::add_pointer_t<QString>>(_a[1]))); break;
        case 3: _t->highlighted((*reinterpret_cast< std::add_pointer_t<int>>(_a[1]))); break;
        case 4: _t->textHighlighted((*reinterpret_cast< std::add_pointer_t<QString>>(_a[1]))); break;
        case 5: _t->currentIndexChanged((*reinterpret_cast< std::add_pointer_t<int>>(_a[1]))); break;
        case 6: _t->currentTextChanged((*reinterpret_cast< std::add_pointer_t<QString>>(_a[1]))); break;
        case 7: _t->clear(); break;
        case 8: _t->clearEditText(); break;
        case 9: _t->setEditText((*reinterpret_cast< std::add_pointer_t<QString>>(_a[1]))); break;
        case 10: _t->setCurrentIndex((*reinterpret_cast< std::add_pointer_t<int>>(_a[1]))); break;
        case 11: _t->setCurrentText((*reinterpret_cast< std::add_pointer_t<QString>>(_a[1]))); break;
        case 12: { QVariant _r = _t->inputMethodQuery((*reinterpret_cast< std::add_pointer_t<Qt::InputMethodQuery>>(_a[1])),(*reinterpret_cast< std::add_pointer_t<QVariant>>(_a[2])));
            if (_a[0]) *reinterpret_cast< QVariant*>(_a[0]) = std::move(_r); }  break;
        default: ;
        }
    }
    if (_c == QMetaObject::IndexOfMethod) {
        if (QtMocHelpers::indexOfMethod<void (QComboBox::*)(const QString & )>(_a, &QComboBox::editTextChanged, 0))
            return;
        if (QtMocHelpers::indexOfMethod<void (QComboBox::*)(int )>(_a, &QComboBox::activated, 1))
            return;
        if (QtMocHelpers::indexOfMethod<void (QComboBox::*)(const QString & )>(_a, &QComboBox::textActivated, 2))
            return;
        if (QtMocHelpers::indexOfMethod<void (QComboBox::*)(int )>(_a, &QComboBox::highlighted, 3))
            return;
        if (QtMocHelpers::indexOfMethod<void (QComboBox::*)(const QString & )>(_a, &QComboBox::textHighlighted, 4))
            return;
        if (QtMocHelpers::indexOfMethod<void (QComboBox::*)(int )>(_a, &QComboBox::currentIndexChanged, 5))
            return;
        if (QtMocHelpers::indexOfMethod<void (QComboBox::*)(const QString & )>(_a, &QComboBox::currentTextChanged, 6))
            return;
    }
    if (_c == QMetaObject::ReadProperty) {
        void *_v = _a[0];
        switch (_id) {
        case 0: *reinterpret_cast<bool*>(_v) = _t->isEditable(); break;
        case 1: *reinterpret_cast<int*>(_v) = _t->count(); break;
        case 2: *reinterpret_cast<QString*>(_v) = _t->currentText(); break;
        case 3: *reinterpret_cast<int*>(_v) = _t->currentIndex(); break;
        case 4: *reinterpret_cast<QVariant*>(_v) = _t->currentData(); break;
        case 5: *reinterpret_cast<int*>(_v) = _t->maxVisibleItems(); break;
        case 6: *reinterpret_cast<int*>(_v) = _t->maxCount(); break;
        case 7: *reinterpret_cast<InsertPolicy*>(_v) = _t->insertPolicy(); break;
        case 8: *reinterpret_cast<SizeAdjustPolicy*>(_v) = _t->sizeAdjustPolicy(); break;
        case 9: *reinterpret_cast<int*>(_v) = _t->minimumContentsLength(); break;
        case 10: *reinterpret_cast<QSize*>(_v) = _t->iconSize(); break;
        case 11: *reinterpret_cast<QString*>(_v) = _t->placeholderText(); break;
        case 12: *reinterpret_cast<bool*>(_v) = _t->duplicatesEnabled(); break;
        case 13: *reinterpret_cast<bool*>(_v) = _t->hasFrame(); break;
        case 14: *reinterpret_cast<int*>(_v) = _t->modelColumn(); break;
        case 15: *reinterpret_cast<LabelDrawingMode*>(_v) = _t->labelDrawingMode(); break;
        default: break;
        }
    }
    if (_c == QMetaObject::WriteProperty) {
        void *_v = _a[0];
        switch (_id) {
        case 0: _t->setEditable(*reinterpret_cast<bool*>(_v)); break;
        case 2: _t->setCurrentText(*reinterpret_cast<QString*>(_v)); break;
        case 3: _t->setCurrentIndex(*reinterpret_cast<int*>(_v)); break;
        case 5: _t->setMaxVisibleItems(*reinterpret_cast<int*>(_v)); break;
        case 6: _t->setMaxCount(*reinterpret_cast<int*>(_v)); break;
        case 7: _t->setInsertPolicy(*reinterpret_cast<InsertPolicy*>(_v)); break;
        case 8: _t->setSizeAdjustPolicy(*reinterpret_cast<SizeAdjustPolicy*>(_v)); break;
        case 9: _t->setMinimumContentsLength(*reinterpret_cast<int*>(_v)); break;
        case 10: _t->setIconSize(*reinterpret_cast<QSize*>(_v)); break;
        case 11: _t->setPlaceholderText(*reinterpret_cast<QString*>(_v)); break;
        case 12: _t->setDuplicatesEnabled(*reinterpret_cast<bool*>(_v)); break;
        case 13: _t->setFrame(*reinterpret_cast<bool*>(_v)); break;
        case 14: _t->setModelColumn(*reinterpret_cast<int*>(_v)); break;
        case 15: _t->setLabelDrawingMode(*reinterpret_cast<LabelDrawingMode*>(_v)); break;
        default: break;
        }
    }
}